

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.c
# Opt level: O2

void dump_mmt_buf_as_words(mmt_buf *buf)

{
  uint uVar1;
  byte *pbVar2;
  ulong uVar3;
  
  for (uVar3 = 0; uVar1 = buf->len, uVar3 < uVar1 >> 2; uVar3 = uVar3 + 1) {
    if (indent_logs == 0) {
      fprintf(_stdout,"LOG:         0x%08x\n",(ulong)buf[uVar3 + 1].len);
    }
    else {
      fprintf(_stdout,"%64s        0x%08x\n"," ");
    }
    if (mmt_sync_fd != -1) {
      fflush(_stdout);
    }
  }
  uVar3 = (long)(int)uVar1 & 0xfffffffffffffffc;
  pbVar2 = (byte *)((long)&buf[1].len + uVar3);
  for (; (uint)uVar3 < uVar1; uVar3 = (ulong)((uint)uVar3 + 1)) {
    if (indent_logs == 0) {
      fprintf(_stdout,"LOG:         0x%02x\n",(ulong)*pbVar2);
    }
    else {
      fprintf(_stdout,"%64s        0x%02x\n"," ");
    }
    if (mmt_sync_fd != -1) {
      fflush(_stdout);
    }
    uVar1 = buf->len;
    pbVar2 = pbVar2 + 1;
  }
  return;
}

Assistant:

void dump_mmt_buf_as_words(struct mmt_buf *buf)
{
	int j;
	for (j = 0; j < buf->len / 4; ++j)
		mmt_log("        0x%08x\n", ((uint32_t *)buf->data)[j]);
	for (j = buf->len / 4 * 4; j < buf->len; ++j)
		mmt_log("        0x%02x\n", buf->data[j]);
}